

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18d51b::StdQualifiedName::printLeft(StdQualifiedName *this,OutputStream *S)

{
  StringView R;
  
  R.Last = "";
  R.First = "std::";
  OutputStream::operator+=(S,R);
  Node::print(this->Child,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "std::";
    Child->print(S);
  }